

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeedForwardNN.h
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall
nnad::FeedForwardNN<double>::Derive
          (FeedForwardNN<double> *this,vector<double,_std::allocator<double>_> *Input)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  Matrix<double> *term;
  const_reference pvVar4;
  mapped_type *i_00;
  mapped_type *j_00;
  const_reference pvVar5;
  reference pvVar6;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var7;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var8;
  const_iterator cVar9;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var10;
  __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> _Var11;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<int,_std::allocator<int>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar12;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_nnad::Matrix<double>_>_>,_bool> pVar13;
  int ip_2;
  int ip_1;
  vector<double,_std::allocator<double>_> prep;
  int ip;
  int Nout;
  Matrix<double> S;
  int j_1;
  int i_1;
  vector<double,_std::allocator<double>_> entries;
  int k_2;
  int j;
  int k_1;
  int i;
  vector<double,_std::allocator<double>_> ylmo;
  vector<double,_std::allocator<double>_> zl;
  int l_1;
  int k;
  Matrix<double> Sigma;
  double *e;
  iterator __end0;
  iterator __begin0;
  vector<double,_std::allocator<double>_> *__range2;
  Matrix<double> M;
  Matrix<double> M_1;
  int l;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  z;
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  y;
  int nl;
  int count;
  vector<double,_std::allocator<double>_> *dNN;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff888;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff890;
  iterator in_stack_fffffffffffff898;
  function<double_(const_double_&)> *in_stack_fffffffffffff8a0;
  Matrix<double> *in_stack_fffffffffffff8a8;
  Matrix<double> *in_stack_fffffffffffff8b0;
  undefined4 in_stack_fffffffffffff8c0;
  int iVar14;
  undefined4 in_stack_fffffffffffff8c4;
  char *in_stack_fffffffffffff8c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d0;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff8d8;
  int in_stack_fffffffffffff8e0;
  int in_stack_fffffffffffff8e4;
  const_iterator in_stack_fffffffffffff8e8;
  Matrix<double> *in_stack_fffffffffffff8f0;
  undefined4 in_stack_fffffffffffff8f8;
  undefined4 in_stack_fffffffffffff8fc;
  Matrix<double> *in_stack_fffffffffffff900;
  double *in_stack_fffffffffffff908;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  int iVar15;
  Matrix<double> *in_stack_fffffffffffff918;
  Matrix<double> *in_stack_fffffffffffff920;
  undefined4 in_stack_fffffffffffff928;
  undefined4 in_stack_fffffffffffff92c;
  value_type vVar16;
  int local_59c;
  int local_54c;
  int local_500;
  int local_4b0;
  int local_4ac;
  int local_48c;
  int local_488;
  int local_484;
  int local_480;
  vector<double,_std::allocator<double>_> local_478;
  vector<double,_std::allocator<double>_> local_460;
  int local_444;
  undefined8 local_440;
  int local_438;
  undefined8 local_430;
  reference local_3f0;
  double *local_3e8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> local_3e0;
  int local_3d4;
  undefined1 local_3d0 [24];
  undefined1 *local_3b8;
  _Base_ptr local_3b0;
  undefined1 local_3a8;
  int local_35c;
  _Base_ptr local_330;
  undefined1 local_328;
  int local_2dc;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  _Base_ptr local_260;
  undefined1 local_258;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  int local_16c;
  int local_124;
  _Base_ptr local_120;
  undefined1 local_118;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_e4;
  int local_58;
  int local_54;
  byte local_4d;
  allocator<char> local_39;
  string local_38 [32];
  vector<double,_std::allocator<double>_> *local_18;
  
  local_18 = in_RDX;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,0);
  if ((int)sVar2 != *pvVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffff8c4,in_stack_fffffffffffff8c0));
    Error((string *)0x104d29);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  local_4d = 0;
  std::vector<int,_std::allocator<int>_>::back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff890._M_current);
  std::allocator<double>::allocator((allocator<double> *)0x104de2);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0,
             (size_type)in_stack_fffffffffffff8a8,(allocator_type *)in_stack_fffffffffffff8a0);
  std::allocator<double>::~allocator((allocator<double> *)0x104e0e);
  local_54 = 0;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  local_58 = (int)sVar2;
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::map((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
         *)0x104e3a);
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::map((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
         *)0x104e47);
  local_e4 = 0;
  sVar2 = std::vector<double,_std::allocator<double>_>::size(local_18);
  local_10c = (undefined4)sVar2;
  local_110 = 1;
  Matrix<double>::Matrix
            (in_stack_fffffffffffff8f0,(int *)in_stack_fffffffffffff8e8._M_current,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8d8._M_current);
  std::pair<const_int,_nnad::Matrix<double>_>::pair<int,_nnad::Matrix<double>,_true>
            ((pair<const_int,_nnad::Matrix<double>_> *)in_stack_fffffffffffff890._M_current,
             (int *)in_stack_fffffffffffff888._M_current,(Matrix<double> *)0x104eb5);
  pVar13 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                     *)in_stack_fffffffffffff8a0,(value_type *)in_stack_fffffffffffff898._M_current)
  ;
  local_120 = (_Base_ptr)pVar13.first._M_node;
  local_118 = pVar13.second;
  std::pair<const_int,_nnad::Matrix<double>_>::~pair
            ((pair<const_int,_nnad::Matrix<double>_> *)0x104f08);
  Matrix<double>::~Matrix((Matrix<double> *)0x104f15);
  for (local_124 = 1; local_124 < local_58 + -1; local_124 = local_124 + 1) {
    std::
    map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
    ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
          *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
    local_16c = local_124 + -1;
    std::
    map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
    ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
          *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
    Matrix<double>::operator*
              ((Matrix<double> *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
               in_stack_fffffffffffff920);
    std::
    map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
    ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
          *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
    Matrix<double>::operator+
              (in_stack_fffffffffffff918,
               (Matrix<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
    Matrix<double>::~Matrix((Matrix<double> *)0x104fff);
    std::function<double_(const_double_&)>::function
              (in_stack_fffffffffffff8a0,
               (function<double_(const_double_&)> *)in_stack_fffffffffffff898._M_current);
    Matrix<double>::Matrix
              (in_stack_fffffffffffff900,
               (Matrix<double> *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (function<double_(const_double_&)> *)in_stack_fffffffffffff8f0);
    std::pair<const_int,_nnad::Matrix<double>_>::pair<int_&,_nnad::Matrix<double>,_true>
              ((pair<const_int,_nnad::Matrix<double>_> *)in_stack_fffffffffffff890._M_current,
               (int *)in_stack_fffffffffffff888._M_current,(Matrix<double> *)0x105056);
    pVar13 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                       *)in_stack_fffffffffffff8a0,
                      (value_type *)in_stack_fffffffffffff898._M_current);
    local_1e8 = (_Base_ptr)pVar13.first._M_node;
    local_1e0 = pVar13.second;
    std::pair<const_int,_nnad::Matrix<double>_>::~pair
              ((pair<const_int,_nnad::Matrix<double>_> *)0x1050a9);
    Matrix<double>::~Matrix((Matrix<double> *)0x1050b6);
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x1050c3)
    ;
    std::function<double_(const_double_&)>::function
              (in_stack_fffffffffffff8a0,
               (function<double_(const_double_&)> *)in_stack_fffffffffffff898._M_current);
    Matrix<double>::Matrix
              (in_stack_fffffffffffff900,
               (Matrix<double> *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
               (function<double_(const_double_&)> *)in_stack_fffffffffffff8f0);
    std::pair<const_int,_nnad::Matrix<double>_>::pair<int_&,_nnad::Matrix<double>,_true>
              ((pair<const_int,_nnad::Matrix<double>_> *)in_stack_fffffffffffff890._M_current,
               (int *)in_stack_fffffffffffff888._M_current,(Matrix<double> *)0x10511a);
    pVar13 = std::
             map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
             ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                       *)in_stack_fffffffffffff8a0,
                      (value_type *)in_stack_fffffffffffff898._M_current);
    local_260 = (_Base_ptr)pVar13.first._M_node;
    local_258 = pVar13.second;
    std::pair<const_int,_nnad::Matrix<double>_>::~pair
              ((pair<const_int,_nnad::Matrix<double>_> *)0x10516d);
    Matrix<double>::~Matrix((Matrix<double> *)0x10517a);
    std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x105187)
    ;
    Matrix<double>::~Matrix((Matrix<double> *)0x105194);
  }
  local_2a4 = local_58 + -1;
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
  local_2a8 = local_58 + -2;
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
  Matrix<double>::operator*
            ((Matrix<double> *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),
             in_stack_fffffffffffff920);
  local_2ac = local_58 + -1;
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
  Matrix<double>::operator+
            (in_stack_fffffffffffff918,
             (Matrix<double> *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910));
  Matrix<double>::~Matrix((Matrix<double> *)0x10543a);
  local_2dc = local_58 + -1;
  std::function<double_(const_double_&)>::function
            (in_stack_fffffffffffff8a0,
             (function<double_(const_double_&)> *)in_stack_fffffffffffff898._M_current);
  Matrix<double>::Matrix
            (in_stack_fffffffffffff900,
             (Matrix<double> *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (function<double_(const_double_&)> *)in_stack_fffffffffffff8f0);
  std::pair<const_int,_nnad::Matrix<double>_>::pair<int,_nnad::Matrix<double>,_true>
            ((pair<const_int,_nnad::Matrix<double>_> *)in_stack_fffffffffffff890._M_current,
             (int *)in_stack_fffffffffffff888._M_current,(Matrix<double> *)0x1054a4);
  pVar13 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                     *)in_stack_fffffffffffff8a0,(value_type *)in_stack_fffffffffffff898._M_current)
  ;
  local_330 = (_Base_ptr)pVar13.first._M_node;
  local_328 = pVar13.second;
  std::pair<const_int,_nnad::Matrix<double>_>::~pair
            ((pair<const_int,_nnad::Matrix<double>_> *)0x1054f7);
  Matrix<double>::~Matrix((Matrix<double> *)0x105504);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x105511);
  local_35c = local_58 + -1;
  std::function<double_(const_double_&)>::function
            (in_stack_fffffffffffff8a0,
             (function<double_(const_double_&)> *)in_stack_fffffffffffff898._M_current);
  Matrix<double>::Matrix
            (in_stack_fffffffffffff900,
             (Matrix<double> *)CONCAT44(in_stack_fffffffffffff8fc,in_stack_fffffffffffff8f8),
             (function<double_(const_double_&)> *)in_stack_fffffffffffff8f0);
  std::pair<const_int,_nnad::Matrix<double>_>::pair<int,_nnad::Matrix<double>,_true>
            ((pair<const_int,_nnad::Matrix<double>_> *)in_stack_fffffffffffff890._M_current,
             (int *)in_stack_fffffffffffff888._M_current,(Matrix<double> *)0x10557b);
  pVar13 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::insert((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                     *)in_stack_fffffffffffff8a0,(value_type *)in_stack_fffffffffffff898._M_current)
  ;
  local_3b0 = (_Base_ptr)pVar13.first._M_node;
  local_3a8 = pVar13.second;
  std::pair<const_int,_nnad::Matrix<double>_>::~pair
            ((pair<const_int,_nnad::Matrix<double>_> *)0x1055ce);
  Matrix<double>::~Matrix((Matrix<double> *)0x1055db);
  std::function<double_(const_double_&)>::~function((function<double_(const_double_&)> *)0x1055e8);
  local_3d4 = local_58 + -1;
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
  Matrix<double>::GetVector((Matrix<double> *)in_stack_fffffffffffff888._M_current);
  local_3b8 = local_3d0;
  local_3e0._M_current =
       (double *)
       std::vector<double,_std::allocator<double>_>::begin(in_stack_fffffffffffff888._M_current);
  local_3e8 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        (in_stack_fffffffffffff888._M_current);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffff890._M_current,
                            (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                             *)in_stack_fffffffffffff888._M_current), bVar1) {
    local_3f0 = __gnu_cxx::
                __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
                operator*(&local_3e0);
    dVar12 = *local_3f0;
    sVar2 = (size_type)local_54;
    local_54 = local_54 + 1;
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,sVar2);
    *pvVar6 = dVar12;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&local_3e0);
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_58 + -1));
  term = (Matrix<double> *)
         std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_58 + -1));
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_58 + -1));
  vVar16 = *pvVar4;
  std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_58 + -1));
  local_430 = 0;
  std::allocator<double>::allocator((allocator<double> *)0x1058d1);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8b0,
             (size_type)in_stack_fffffffffffff8a8,(value_type_conflict1 *)in_stack_fffffffffffff8a0,
             (allocator_type *)in_stack_fffffffffffff898._M_current);
  Matrix<double>::Matrix
            (in_stack_fffffffffffff8f0,(int *)in_stack_fffffffffffff8e8._M_current,
             (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
             (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8d8._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
  std::allocator<double>::~allocator((allocator<double> *)0x105939);
  local_438 = 0;
  while (iVar15 = local_438,
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_58 + -1)),
        local_444 = local_58, iVar15 < *pvVar4) {
    local_440 = 0x3ff0000000000000;
    Matrix<double>::SetElement
              (term,pvVar3,(int *)CONCAT44(iVar15,in_stack_fffffffffffff910),
               in_stack_fffffffffffff908);
    local_438 = local_438 + 1;
  }
  while (local_444 = local_444 + -1, 0 < local_444) {
    i_00 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                 *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
    Matrix<double>::GetVector((Matrix<double> *)in_stack_fffffffffffff888._M_current);
    j_00 = std::
           map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
           ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
                 *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
    Matrix<double>::GetVector((Matrix<double> *)in_stack_fffffffffffff888._M_current);
    local_480 = 0;
    while (iVar14 = local_480,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_444),
          iVar14 < *pvVar3) {
      local_484 = 0;
      while (iVar14 = local_484,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_RSI,(long)(local_58 + -1)), iVar14 < *pvVar3) {
        in_stack_fffffffffffff8f0 =
             (Matrix<double> *)
             Matrix<double>::GetElement
                       ((Matrix<double> *)CONCAT44(iVar15,in_stack_fffffffffffff910),&i_00->_Lines,
                        &j_00->_Lines);
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_460,(long)local_480);
        in_stack_fffffffffffff8e8._M_current =
             (double *)((double)in_stack_fffffffffffff8f0 * *pvVar5);
        sVar2 = (size_type)local_54;
        local_54 = local_54 + 1;
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,sVar2);
        *pvVar6 = (value_type)in_stack_fffffffffffff8e8._M_current;
        local_484 = local_484 + 1;
      }
      local_488 = 0;
      while (in_stack_fffffffffffff8e4 = local_488,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_RSI,(long)(local_444 + -1)), in_stack_fffffffffffff8e4 < *pvVar3)
      {
        local_48c = 0;
        while (in_stack_fffffffffffff8e0 = local_48c,
              pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_RSI,(long)(local_58 + -1)), in_stack_fffffffffffff8e0 < *pvVar3
              ) {
          in_stack_fffffffffffff8d8._M_current =
               (double *)
               Matrix<double>::GetElement
                         ((Matrix<double> *)CONCAT44(iVar15,in_stack_fffffffffffff910),&i_00->_Lines
                          ,&j_00->_Lines);
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_460,(long)local_480);
          dVar12 = (double)in_stack_fffffffffffff8d8._M_current * *pvVar5;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&local_478,(long)local_488);
          in_stack_fffffffffffff8d0 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (dVar12 * *pvVar5);
          sVar2 = (size_type)local_54;
          local_54 = local_54 + 1;
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,sVar2);
          *pvVar6 = (value_type)in_stack_fffffffffffff8d0;
          local_48c = local_48c + 1;
        }
        local_488 = local_488 + 1;
      }
      local_480 = local_480 + 1;
    }
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x105d66);
    local_4ac = 0;
    while (iVar14 = local_4ac,
          pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_444),
          iVar14 < *pvVar3) {
      local_4b0 = 0;
      while (iVar14 = local_4b0,
            pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                               (in_RSI,(long)(local_444 + -1)), iVar14 < *pvVar3) {
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&local_460,(long)local_4ac);
        in_stack_fffffffffffff8b0 = (Matrix<double> *)*pvVar5;
        std::
        map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
        ::at((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
              *)in_stack_fffffffffffff8b0,&in_stack_fffffffffffff8a8->_Lines);
        in_stack_fffffffffffff8a8 =
             (Matrix<double> *)
             Matrix<double>::GetElement
                       ((Matrix<double> *)CONCAT44(iVar15,in_stack_fffffffffffff910),&i_00->_Lines,
                        &j_00->_Lines);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff890._M_current,
                   in_stack_fffffffffffff888._M_current);
        local_4b0 = local_4b0 + 1;
      }
      local_4ac = local_4ac + 1;
    }
    in_stack_fffffffffffff8a0 =
         (function<double_(const_double_&)> *)
         std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_444);
    std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)(local_444 + -1));
    Matrix<double>::Matrix
              (in_stack_fffffffffffff8f0,(int *)in_stack_fffffffffffff8e8._M_current,
               (int *)CONCAT44(in_stack_fffffffffffff8e4,in_stack_fffffffffffff8e0),
               (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8d8._M_current);
    Matrix<double>::operator*((Matrix<double> *)CONCAT44(vVar16,in_stack_fffffffffffff928),term);
    Matrix<double>::operator=(in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8);
    Matrix<double>::~Matrix((Matrix<double> *)0x105f51);
    Matrix<double>::~Matrix((Matrix<double> *)0x105f5e);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
  }
  bVar1 = std::operator!=((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                           *)in_stack_fffffffffffff890._M_current,
                          in_stack_fffffffffffff888._M_current);
  if (bVar1) {
    std::vector<int,_std::allocator<int>_>::back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff890._M_current);
    for (local_500 = 0;
        local_500 <
        *(int *)&in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish; local_500 = local_500 + 1) {
      std::vector<double,_std::allocator<double>_>::end
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      __gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>::
      __normal_iterator<double*>
                ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_> *
                 )in_stack_fffffffffffff890._M_current,
                 (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                 in_stack_fffffffffffff888._M_current);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
      operator+((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *)
                in_stack_fffffffffffff898._M_current,
                (difference_type)in_stack_fffffffffffff890._M_current);
      _Var7._M_current._4_4_ = in_stack_fffffffffffff8e4;
      _Var7._M_current._0_4_ = in_stack_fffffffffffff8e0;
      in_stack_fffffffffffff898 =
           std::vector<double,std::allocator<double>>::
           insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,void>
                     ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8d0,
                      in_stack_fffffffffffff8e8,_Var7,in_stack_fffffffffffff8d8);
    }
    std::
    function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
    ::operator()((function<std::vector<double,_std::allocator<double>_>_(const_std::vector<double,_std::allocator<double>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
                  *)in_stack_fffffffffffff8a8,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0,
                 (vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff898._M_current);
    for (local_54c = 0;
        local_54c <
        *(int *)&in_RSI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1; local_54c = local_54c + 1) {
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current)
      ;
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current)
      ;
      cVar9 = std::vector<double,_std::allocator<double>_>::begin
                        (in_stack_fffffffffffff888._M_current);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var10 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current
                          );
      in_stack_fffffffffffff890 =
           std::
           transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
                     (_Var7._M_current,_Var8._M_current,cVar9._M_current,_Var10._M_current);
    }
    local_59c = *(int *)&in_RSI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
    while (local_59c = local_59c + 1,
          local_59c <
          *(int *)&in_RSI[9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish +
          *(int *)&in_RSI[6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1) {
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var7 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current)
      ;
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var8 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
              ::operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current)
      ;
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var11 = __gnu_cxx::
               __normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>::
               operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current);
      std::vector<double,_std::allocator<double>_>::begin
                ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff888._M_current);
      _Var10 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
               ::operator+(in_stack_fffffffffffff898._M_current,in_stack_fffffffffffff890._M_current
                          );
      in_stack_fffffffffffff888 =
           std::
           transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::multiplies<double>>
                     (_Var7._M_current,_Var8._M_current,_Var11._M_current,_Var10._M_current);
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
  }
  local_4d = 1;
  Matrix<double>::~Matrix((Matrix<double> *)0x106477);
  Matrix<double>::~Matrix((Matrix<double> *)0x106484);
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::~map((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
          *)0x106491);
  std::
  map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
  ::~map((map<int,_nnad::Matrix<double>,_std::less<int>,_std::allocator<std::pair<const_int,_nnad::Matrix<double>_>_>_>
          *)0x10649e);
  if ((local_4d & 1) == 0) {
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff8a0);
  }
  return in_RDI;
}

Assistant:

std::vector<T> Derive(std::vector<T> const& Input) const
    {
      // Check that the size of the input vector is equal to the number of
      // input nodes.
      if ((int) Input.size() != _Arch[0])
        Error("Derive: the number of inputs does not match the number of input nodes.");

      // Initialise dNN vector
      std::vector<T> dNN((_Np + 1) * _Arch.back());

      // Element counter
      int count = 0;

      // Number of layers
      const int nl = (int) _Arch.size();

      // Compute NN recursively and save the quantities that will be
      // needed to compute the derivatives.
      std::map<int, Matrix<T>> y;
      std::map<int, Matrix<T>> z;
      y.insert({0, Matrix<T>{(int) Input.size(), 1, Input}});
      for (int l = 1; l < nl - 1; l++)
        {
          const Matrix<T> M = _Links.at(l) * y.at(l - 1) + _Biases.at(l);
          y.insert({l, Matrix<T>{M, _ActFun}});
          z.insert({l, Matrix<T>{M, _dActFun}});
        }

      // Now take care of the output layer according to the selected
      // output function.
      const Matrix<T> M = _Links.at(nl - 1) * y.at(nl - 2) + _Biases.at(nl - 1);
      y.insert({nl - 1, Matrix<T>{M, _OutputActFun}});
      z.insert({nl - 1, Matrix<T>{M, _dOutputActFun}});

      // Output vector of vectors. Push back NN itself as a first
      // element.
      for (auto const& e : y.at(nl - 1).GetVector())
        dNN[count++] = e;

      // First compute the Sigma matrix on the output layer that is just
      // the unity matrix.
      Matrix<T> Sigma(_Arch[nl - 1], _Arch[nl - 1], std::vector<T>(_Arch[nl - 1] * _Arch[nl - 1], T(0.)));
      for (int k = 0; k < _Arch[nl - 1]; k++)
        Sigma.SetElement(k, k, T(1));

      // Now run backwards on the layers to compute the derivatives
      for (int l = nl - 1; l > 0; l--)
        {
          const std::vector<T> zl = z.at(l).GetVector();
          const std::vector<T> ylmo = y.at(l - 1).GetVector();
          for (int i = 0; i < _Arch[l]; i++)
            {
              // Compute derivatives w.r.t. the biases
              for (int k = 0; k < _Arch[nl - 1]; k++)
                dNN[count++] = Sigma.GetElement(k, i) * zl[i];

              // Compute derivatives w.r.t. the links
              for (int j = 0; j < _Arch[l - 1]; j++)
                for (int k = 0; k < _Arch[nl - 1]; k++)
                  dNN[count++] = Sigma.GetElement(k, i) * zl[i] * ylmo[j];
            }

          // Compute Matrix "S" on this layer
          std::vector<T> entries;
          for (int i = 0; i < _Arch[l]; i++)
            for (int j = 0; j < _Arch[l - 1]; j++)
              entries.push_back(zl[i] * _Links.at(l).GetElement(i, j));
          const Matrix<T> S{_Arch[l], _Arch[l - 1], entries};

          // Update Matrix "Sigma" for the next step
          Sigma = Sigma * S;
        }

      // Include preprocessing function if necessary
      if (_Preproc != nullptr)
        {
          // Get number of outputs
          const int Nout = _Arch.back();

          // Append to the vector dNN the NN mupliplied by the
          // derivative of the preprocessing function.
          for (int ip = 0; ip < _NpPrep; ip++)
            dNN.insert(dNN.end(), dNN.begin(), dNN.begin() + Nout);

          // Get preprocessing function
          const std::vector<T> prep = _Preproc(Input, _PreprocPars);

          // Multiply dNN by the preprocessing function, i.e. the
          // first Nout outputs of prep.
          for (int ip = 0; ip < _Np + 1; ip++)
            std::transform(dNN.begin() + Nout * ip, dNN.begin() + Nout * ( ip + 1 ), prep.begin(), dNN.begin() + Nout * ip, std::multiplies<T>());

          // Now multiply the last _NpPrep bunches of Nout entries of
          // dNN (that for now only contain _NpPrep copies the NN
          // itself) by the _NpPrep derivatives of the preprocessing
          // function.
          for (int ip = _Np + 1; ip < _Np + _NpPrep + 1; ip++)
            std::transform(dNN.begin() + Nout * ip, dNN.begin() + Nout * ( ip + 1 ), prep.begin() + Nout * ( ip - _Np ), dNN.begin() + Nout * ip, std::multiplies<T>());
        }

      return dNN;
    }